

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O1

REF_STATUS
ref_recon_kexact_rs(REF_GLOB center_global,REF_CLOUD ref_cloud,REF_DBL *rn,REF_DBL *sn,
                   REF_DBL *hessian)

{
  uint uVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  uint uVar4;
  REF_STATUS RVar5;
  REF_DBL *pRVar6;
  REF_DBL *pRVar7;
  long lVar8;
  double *pdVar9;
  undefined8 uVar10;
  REF_DBL *pRVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int m;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  size_t __size;
  double dVar18;
  double dVar19;
  REF_LONG ref_private_status_reis_ai;
  REF_DBL geom [3];
  REF_DBL xyzs [4];
  REF_DBL ab [12];
  uint local_110;
  uint local_10c;
  ulong local_108;
  REF_DBL *local_100;
  ulong local_f8;
  REF_DBL *local_f0;
  REF_GLOB local_e8;
  REF_DBL *local_e0;
  double local_d8 [4];
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  REF_DBL local_98 [9];
  double dStack_50;
  REF_DBL local_48;
  REF_DBL RStack_40;
  
  uVar3 = ref_cloud_item(ref_cloud,center_global,(REF_INT *)&local_110);
  if (uVar3 == 0) {
    lVar8 = (long)ref_cloud->naux;
    local_e8 = center_global;
    if (0 < lVar8) {
      memcpy(&local_b8,ref_cloud->aux + (int)local_110 * lVar8,lVar8 * 8);
    }
    uVar17 = (ulong)ref_cloud->n;
    uVar4 = 4;
    if (3 < (long)uVar17) {
      uVar4 = ref_cloud->n - 1;
      local_108 = (ulong)uVar4;
      __size = (ulong)(uVar4 * 3) << 3;
      local_10c = uVar3;
      local_f8 = lVar8;
      pRVar6 = (REF_DBL *)malloc(__size);
      if (pRVar6 == (REF_DBL *)0x0) {
        pcVar15 = "malloc a of REF_DBL NULL";
        uVar10 = 0x619;
      }
      else {
        local_100 = pRVar6;
        local_f0 = (REF_DBL *)malloc(__size);
        if (local_f0 == (REF_DBL *)0x0) {
          pcVar15 = "malloc q of REF_DBL NULL";
          uVar10 = 0x61a;
        }
        else {
          pRVar6 = (REF_DBL *)malloc(0x48);
          if (pRVar6 != (REF_DBL *)0x0) {
            lVar8 = *ref_cloud->global;
            iVar14 = (int)local_108;
            uVar16 = 0;
            iVar12 = 0;
            do {
              if (lVar8 != local_e8) {
                pRVar2 = ref_cloud->aux;
                lVar8 = uVar16 * local_f8;
                dVar19 = rn[2] * (pRVar2[lVar8 + 2] - local_a8) +
                         *rn * (pRVar2[lVar8] - local_b8) + rn[1] * (pRVar2[lVar8 + 1] - local_b0);
                dVar18 = (pRVar2[lVar8 + 2] - local_a8) * sn[2] +
                         (pRVar2[lVar8] - local_b8) * *sn + (pRVar2[lVar8 + 1] - local_b0) * sn[1];
                local_d8[0] = dVar19 * 0.5 * dVar19;
                local_d8[1] = dVar19 * dVar18;
                local_d8[2] = dVar18 * 0.5 * dVar18;
                pdVar9 = local_100 + iVar12;
                lVar8 = 0;
                do {
                  *pdVar9 = local_d8[lVar8];
                  lVar8 = lVar8 + 1;
                  pdVar9 = pdVar9 + iVar14;
                } while (lVar8 != 3);
                iVar12 = iVar12 + 1;
              }
              uVar16 = uVar16 + 1;
              lVar8 = -1;
              if (uVar16 < uVar17) {
                lVar8 = ref_cloud->global[uVar16];
              }
            } while (uVar16 != uVar17);
            local_110 = (uint)uVar16;
            uVar17 = local_108 & 0xffffffff;
            m = iVar14;
            local_e0 = hessian;
            if (iVar14 != iVar12) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x62e,"ref_recon_kexact_rs","A row miscount",uVar17,(long)iVar12);
              m = (int)local_108;
              local_10c = 1;
            }
            pRVar2 = local_f0;
            if (m != iVar12) {
              return local_10c;
            }
            local_f8 = uVar17;
            uVar3 = ref_matrix_qr(m,3,local_100,local_f0,pRVar6);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x62f,"ref_recon_kexact_rs",(ulong)uVar3,"kexact lsq hess qr");
              return uVar3;
            }
            pRVar7 = local_98;
            local_48 = 0.0;
            RStack_40 = 0.0;
            local_98[8] = 0.0;
            dStack_50 = 0.0;
            local_98[6] = 0.0;
            local_98[7] = 0.0;
            local_98[4] = 0.0;
            local_98[5] = 0.0;
            local_98[2] = 0.0;
            local_98[3] = 0.0;
            local_98[0] = 0.0;
            local_98[1] = 0.0;
            lVar8 = 0;
            pRVar11 = pRVar6;
            do {
              lVar13 = 0;
              do {
                *(double *)((long)pRVar7 + lVar13) =
                     *(double *)((long)pRVar11 + lVar13) + *(double *)((long)pRVar7 + lVar13);
                lVar13 = lVar13 + 0x18;
              } while (lVar13 != 0x48);
              lVar8 = lVar8 + 1;
              pRVar7 = pRVar7 + 1;
              pRVar11 = pRVar11 + 1;
            } while (lVar8 != 3);
            local_110 = 0;
            uVar3 = ref_cloud->n;
            if ((int)uVar3 < 1) {
              lVar8 = -1;
            }
            else {
              lVar8 = *ref_cloud->global;
            }
            iVar12 = 0;
            if (0 < (int)uVar3) {
              iVar12 = 0;
              uVar4 = 0;
              do {
                if (lVar8 != local_e8) {
                  dVar18 = ref_cloud->aux[(long)(int)uVar4 * (long)ref_cloud->naux + 3];
                  pdVar9 = pRVar2 + iVar12;
                  lVar8 = 0;
                  do {
                    (&dStack_50)[lVar8] = *pdVar9 * (dVar18 - local_a0) + (&dStack_50)[lVar8];
                    lVar8 = lVar8 + 1;
                    pdVar9 = pdVar9 + iVar14;
                  } while (lVar8 != 3);
                  iVar12 = iVar12 + 1;
                }
                uVar1 = uVar4 + 1;
                lVar8 = -1;
                if ((int)uVar1 < (int)uVar3 && -2 < (int)uVar4) {
                  lVar8 = ref_cloud->global[uVar1];
                }
                uVar4 = uVar1;
                local_110 = uVar3;
              } while (uVar1 != uVar3);
            }
            iVar14 = (int)local_108;
            uVar3 = local_10c;
            if (iVar14 != iVar12) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x640,"ref_recon_kexact_rs","b row miscount",local_f8,(long)iVar12);
              iVar14 = (int)local_108;
              uVar3 = 1;
            }
            if (iVar14 != iVar12) {
              return uVar3;
            }
            RVar5 = ref_matrix_solve_ab(3,4,local_98);
            if (RVar5 != 0) {
              return RVar5;
            }
            local_e0[2] = RStack_40;
            *local_e0 = dStack_50;
            local_e0[1] = local_48;
            free(pRVar6);
            free(local_f0);
            free(local_100);
            return 0;
          }
          pcVar15 = "malloc r of REF_DBL NULL";
          uVar10 = 0x61b;
        }
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
             uVar10,"ref_recon_kexact_rs",pcVar15);
      uVar4 = 2;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x60a,
           "ref_recon_kexact_rs",(ulong)uVar3,"missing center");
    uVar4 = uVar3;
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_recon_kexact_rs(REF_GLOB center_global,
                                       REF_CLOUD ref_cloud, REF_DBL *rn,
                                       REF_DBL *sn, REF_DBL *hessian) {
  REF_DBL geom[3], ab[12];
  REF_DBL dxyz[3], dq, dr, ds;
  REF_DBL *a, *q, *r;
  REF_INT m, n;
  REF_GLOB cloud_global;
  REF_INT item, im, i, j;
  REF_DBL xyzs[4];
  REF_BOOL verbose = REF_FALSE;

  RSS(ref_cloud_item(ref_cloud, center_global, &item), "missing center");
  each_ref_cloud_aux(ref_cloud, i) {
    xyzs[i] = ref_cloud_aux(ref_cloud, i, item);
  }
  /* solve A with QR factorization size m x n */
  m = ref_cloud_n(ref_cloud) - 1; /* skip self */
  n = 3;
  if (verbose)
    printf("m %d at %f %f %f %f\n", m, xyzs[0], xyzs[1], xyzs[2], xyzs[3]);
  if (verbose)
    printf("r %f %f %f\ns %f %f %f\n", rn[0], rn[1], rn[2], sn[0], sn[1],
           sn[2]);
  if (m < n) {           /* underdetermined, will end badly */
    return REF_DIV_ZERO; /* signal cloud growth required */
  }
  ref_malloc(a, m * n, REF_DBL);
  ref_malloc(q, m * n, REF_DBL);
  ref_malloc(r, n * n, REF_DBL);
  i = 0;
  each_ref_cloud_global(ref_cloud, item, cloud_global) {
    if (center_global == cloud_global) continue; /* skip self */
    dxyz[0] = ref_cloud_aux(ref_cloud, 0, item) - xyzs[0];
    dxyz[1] = ref_cloud_aux(ref_cloud, 1, item) - xyzs[1];
    dxyz[2] = ref_cloud_aux(ref_cloud, 2, item) - xyzs[2];
    dr = ref_math_dot(dxyz, rn);
    ds = ref_math_dot(dxyz, sn);
    geom[0] = 0.5 * dr * dr;
    geom[1] = dr * ds;
    geom[2] = 0.5 * ds * ds;
    for (j = 0; j < n; j++) {
      a[i + m * j] = geom[j];
      if (verbose) printf(" %12.4e", geom[j]);
    }
    if (verbose) printf(" %f %f %d\n", dr, ds, i);
    i++;
  }
  REIS(m, i, "A row miscount");
  RSS(ref_matrix_qr(m, n, a, q, r), "kexact lsq hess qr");
  if (verbose) RSS(ref_matrix_show_aqr(m, n, a, q, r), "show qr");
  for (i = 0; i < (n + 1) * n; i++) ab[i] = 0.0;
  for (i = 0; i < n; i++) {
    for (j = 0; j < n; j++) {
      ab[i + n * j] += r[i + n * j];
    }
  }
  i = 0;
  each_ref_cloud_global(ref_cloud, item, cloud_global) {
    if (center_global == cloud_global) continue; /* skip self */
    dq = ref_cloud_aux(ref_cloud, 3, item) - xyzs[3];
    for (j = 0; j < n; j++) {
      ab[j + n * n] += q[i + m * j] * dq;
    }
    i++;
  }
  REIS(m, i, "b row miscount");
  if (verbose) RSS(ref_matrix_show_ab(n, n + 1, ab), "show");
  RAISE(ref_matrix_solve_ab(n, n + 1, ab));
  if (verbose) RSS(ref_matrix_show_ab(n, n + 1, ab), "show");
  j = n;
  for (im = 0; im < 3; im++) {
    hessian[im] = ab[im + n * j];
  }
  ref_free(r);
  ref_free(q);
  ref_free(a);

  return REF_SUCCESS;
}